

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.cpp
# Opt level: O0

istream * baryonyx::operator>>(istream *is,result *ret)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  file_format_failure *pfVar6;
  char *pcVar7;
  size_type sVar8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  element_type *this_00;
  reference this_01;
  int *piVar9;
  string_view sVar10;
  undefined1 in_stack_00000168 [16];
  bool local_d9;
  char *local_d8;
  string_view local_c8;
  _Optional_payload_base<int> local_b8;
  size_t local_b0;
  _Optional_payload_base<int> local_a8;
  optional<int> value;
  string_view right;
  string_view left;
  size_type found;
  size_type e;
  size_type i;
  undefined1 local_58 [8];
  string buffer;
  undefined1 local_30 [4];
  int line;
  result *local_20;
  result *ret_local;
  istream *is_local;
  
  local_20 = ret;
  ret_local = (result *)is;
  std::make_shared<baryonyx::string_buffer>();
  std::shared_ptr<baryonyx::string_buffer>::operator=
            (&local_20->strings,(shared_ptr<baryonyx::string_buffer> *)local_30);
  std::shared_ptr<baryonyx::string_buffer>::~shared_ptr
            ((shared_ptr<baryonyx::string_buffer> *)local_30);
  local_20->status = success;
  std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::emplace_back<>
            (&local_20->solutions);
  buffer.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_58);
LAB_002f79ad:
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)ret_local,(string *)local_58);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
    if (bVar2) {
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) goto LAB_002f7d2e;
    }
    e = 0;
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
    for (; e != sVar4; e = e + 1) {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,e);
      iVar3 = isspace((int)*pvVar5);
      if (iVar3 == 0) break;
    }
    if (e != sVar4) goto code_r0x002f7aa6;
    goto LAB_002f7ad0;
  }
LAB_002f7d2e:
  is_local = (istream *)ret_local;
  std::__cxx11::string::~string((string *)local_58);
  return is_local;
code_r0x002f7aa6:
  pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      e);
  if (*pvVar5 != '\\') {
LAB_002f7ad0:
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,'=',0);
    if (sVar4 == 0xffffffffffffffff) {
      pfVar6 = (file_format_failure *)__cxa_allocate_exception(0x40);
      file_format_failure::file_format_failure(pfVar6,bad_name,buffer.field_2._12_4_,0);
      __cxa_throw(pfVar6,&file_format_failure::typeinfo,file_format_failure::~file_format_failure);
    }
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&right._M_str,pcVar7,sVar4);
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&value,pcVar7 + sVar4 + 1,
               sVar8 - sVar4);
    local_b8 = (_Optional_payload_base<int>)
               value.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
    local_b0 = right._M_len;
    local_a8 = (_Optional_payload_base<int>)to_int((string_view)in_stack_00000168);
    bVar2 = std::optional<int>::has_value((optional<int> *)&local_a8);
    if (!bVar2) {
      pfVar6 = (file_format_failure *)__cxa_allocate_exception(0x40);
      file_format_failure::file_format_failure(pfVar6,bad_name,buffer.field_2._12_4_,0);
      __cxa_throw(pfVar6,&file_format_failure::typeinfo,file_format_failure::~file_format_failure);
    }
    this = &local_20->variable_name;
    this_00 = std::
              __shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
    local_d8 = right._M_str;
    sVar10._M_str = (char *)left._M_len;
    sVar10._M_len = (size_t)right._M_str;
    sVar10 = string_buffer::append(this_00,sVar10);
    local_c8 = sVar10;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)this,&local_c8);
    this_01 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                        (&local_20->solutions);
    piVar9 = std::optional<int>::operator*((optional<int> *)&local_a8);
    local_d9 = *piVar9 != 0;
    std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<bool>
              (&this_01->variables,&local_d9);
    buffer.field_2._12_4_ = buffer.field_2._12_4_ + 1;
  }
  goto LAB_002f79ad;
}

Assistant:

std::istream&
operator>>(std::istream& is, result& ret)
{
    ret.strings = std::make_shared<baryonyx::string_buffer>();

    ret.status = result_status::success;
    ret.solutions.emplace_back();
    int line{ 0 };

    std::string buffer;
    while (is.good()) {
        std::getline(is, buffer);

        if (buffer.empty() && is.eof())
            return is;

        std::string::size_type i{ 0 };
        std::string::size_type e{ buffer.size() };

        for (; i != e; ++i)
            if (!std::isspace(buffer[i]))
                break;

        if (i != e && buffer[i] == '\\')
            continue;

        auto found = buffer.find('=', 0);
        if (found == std::string::npos)
            throw file_format_failure(
              file_format_error_tag::bad_name, line, 0);

        std::string_view left(buffer.data(), found);
        std::string_view right(buffer.data() + found + 1,
                               buffer.size() - found);

        if (auto value = to_int(right); value.has_value()) {
            ret.variable_name.emplace_back(ret.strings->append(left));
            ret.solutions.back().variables.emplace_back(!!(*value));
        } else {
            throw file_format_failure(
              file_format_error_tag::bad_name, line, 0);
        }
        ++line;
    }

    return is;
}